

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_int.cc
# Opt level: O0

ASN1_INTEGER * c2i_ASN1_INTEGER(ASN1_INTEGER **a,uchar **pp,long length)

{
  int iVar1;
  size_t sVar2;
  uint8_t *puVar3;
  bool bVar4;
  ASN1_STRING *local_48;
  ASN1_INTEGER *ret;
  undefined1 local_38 [4];
  int is_negative;
  CBS cbs;
  long len_local;
  uchar **inp_local;
  ASN1_INTEGER **out_local;
  
  cbs.len = length;
  if ((length < 0) || (0x3fffffff < length)) {
    ERR_put_error(0xc,0,0xb1,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/a_int.cc"
                  ,0x9b);
    out_local = (ASN1_INTEGER **)0x0;
  }
  else {
    CBS_init((CBS *)local_38,*pp,length);
    iVar1 = CBS_is_valid_asn1_integer((CBS *)local_38,(int *)((long)&ret + 4));
    if (iVar1 == 0) {
      ERR_put_error(0xc,0,0xc4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/a_int.cc"
                    ,0xa3);
      out_local = (ASN1_INTEGER **)0x0;
    }
    else {
      if ((a == (ASN1_INTEGER **)0x0) || (*a == (ASN1_INTEGER *)0x0)) {
        local_48 = (ASN1_STRING *)ASN1_INTEGER_new();
        if (local_48 == (ASN1_STRING *)0x0) {
          return (ASN1_INTEGER *)0x0;
        }
      }
      else {
        local_48 = (ASN1_STRING *)*a;
      }
      if (ret._4_4_ == 0) {
        sVar2 = CBS_len((CBS *)local_38);
        if ((sVar2 != 0) && (puVar3 = CBS_data((CBS *)local_38), *puVar3 == '\0')) {
          CBS_skip((CBS *)local_38,1);
        }
      }
      else {
        sVar2 = CBS_len((CBS *)local_38);
        if ((sVar2 != 0) && (puVar3 = CBS_data((CBS *)local_38), *puVar3 == 0xff)) {
          puVar3 = CBS_data((CBS *)local_38);
          sVar2 = CBS_len((CBS *)local_38);
          iVar1 = is_all_zeros(puVar3 + 1,sVar2 - 1);
          if (iVar1 == 0) {
            CBS_skip((CBS *)local_38,1);
          }
        }
      }
      puVar3 = CBS_data((CBS *)local_38);
      sVar2 = CBS_len((CBS *)local_38);
      iVar1 = ASN1_STRING_set(local_48,puVar3,sVar2);
      if (iVar1 == 0) {
        if ((local_48 != (ASN1_STRING *)0x0) &&
           ((a == (ASN1_INTEGER **)0x0 || (*a != (ASN1_INTEGER *)local_48)))) {
          ASN1_INTEGER_free((ASN1_INTEGER *)local_48);
        }
        out_local = (ASN1_INTEGER **)0x0;
      }
      else {
        if (ret._4_4_ == 0) {
          local_48->type = 2;
        }
        else {
          local_48->type = 0x102;
          negate_twos_complement(local_48->data,(long)local_48->length);
        }
        bVar4 = true;
        if (local_48->length != 0) {
          bVar4 = *local_48->data != '\0';
        }
        if (!bVar4) {
          __assert_fail("ret->length == 0 || ret->data[0] != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/a_int.cc"
                        ,0xcf,
                        "ASN1_INTEGER *c2i_ASN1_INTEGER(ASN1_INTEGER **, const unsigned char **, long)"
                       );
        }
        bVar4 = true;
        if (ret._4_4_ != 0) {
          bVar4 = 0 < local_48->length;
        }
        if (!bVar4) {
          __assert_fail("!is_negative || ret->length > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/a_int.cc"
                        ,0xd1,
                        "ASN1_INTEGER *c2i_ASN1_INTEGER(ASN1_INTEGER **, const unsigned char **, long)"
                       );
        }
        *pp = *pp + cbs.len;
        if (a != (ASN1_INTEGER **)0x0) {
          *a = (ASN1_INTEGER *)local_48;
        }
        out_local = (ASN1_INTEGER **)local_48;
      }
    }
  }
  return (ASN1_INTEGER *)out_local;
}

Assistant:

ASN1_INTEGER *c2i_ASN1_INTEGER(ASN1_INTEGER **out, const unsigned char **inp,
                               long len) {
  // This function can handle lengths up to INT_MAX - 1, but the rest of the
  // legacy ASN.1 code mixes integer types, so avoid exposing it to
  // ASN1_INTEGERS with larger lengths.
  if (len < 0 || len > INT_MAX / 2) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_TOO_LONG);
    return NULL;
  }

  CBS cbs;
  CBS_init(&cbs, *inp, (size_t)len);
  int is_negative;
  if (!CBS_is_valid_asn1_integer(&cbs, &is_negative)) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_INVALID_INTEGER);
    return NULL;
  }

  ASN1_INTEGER *ret = NULL;
  if (out == NULL || *out == NULL) {
    ret = ASN1_INTEGER_new();
    if (ret == NULL) {
      return NULL;
    }
  } else {
    ret = *out;
  }

  // Convert to |ASN1_INTEGER|'s sign-and-magnitude representation. First,
  // determine the size needed for a minimal result.
  if (is_negative) {
    // 0xff00...01 through 0xff7f..ff have a two's complement of 0x00ff...ff
    // through 0x000100...001 and need one leading zero removed. 0x8000...00
    // through 0xff00...00 have a two's complement of 0x8000...00 through
    // 0x0100...00 and will be minimally-encoded as-is.
    if (CBS_len(&cbs) > 0 && CBS_data(&cbs)[0] == 0xff &&
        !is_all_zeros(CBS_data(&cbs) + 1, CBS_len(&cbs) - 1)) {
      CBS_skip(&cbs, 1);
    }
  } else {
    // Remove the leading zero byte, if any.
    if (CBS_len(&cbs) > 0 && CBS_data(&cbs)[0] == 0x00) {
      CBS_skip(&cbs, 1);
    }
  }

  if (!ASN1_STRING_set(ret, CBS_data(&cbs), CBS_len(&cbs))) {
    goto err;
  }

  if (is_negative) {
    ret->type = V_ASN1_NEG_INTEGER;
    negate_twos_complement(ret->data, ret->length);
  } else {
    ret->type = V_ASN1_INTEGER;
  }

  // The value should be minimally-encoded.
  assert(ret->length == 0 || ret->data[0] != 0);
  // Zero is not negative.
  assert(!is_negative || ret->length > 0);

  *inp += len;
  if (out != NULL) {
    *out = ret;
  }
  return ret;

err:
  if (ret != NULL && (out == NULL || *out != ret)) {
    ASN1_INTEGER_free(ret);
  }
  return NULL;
}